

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conf.c
# Opt level: O3

int conf_parse_file(char *file,proxy_conf *conf,log_handle *log)

{
  byte bVar1;
  bool bVar2;
  long lVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  byte *__ptr;
  long lVar7;
  char **ppcVar8;
  char *pcVar9;
  int *piVar10;
  byte *pbVar11;
  byte *pbVar12;
  ulong uVar13;
  ulong uVar14;
  byte *__s1;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  uint uVar18;
  ulong uVar19;
  byte *pbVar20;
  size_t __n;
  byte *__src;
  undefined1 local_6a [2];
  log_handle *local_68;
  ulong local_60;
  FILE *local_58;
  ulong local_50;
  ulong local_48;
  uint16_t *local_40;
  uint32_t *local_38;
  
  local_68 = log;
  log_printf(log,LOG_LEVEL_DEBUG,"Loading proxy config from \'%s\'\n",file);
  local_58 = fopen(file,"r");
  if (local_58 == (FILE *)0x0) {
    piVar10 = __errno_location();
    return -*piVar10;
  }
  local_38 = &conf->connection_timeout;
  local_40 = &conf->port;
LAB_0010295c:
  __ptr = (byte *)malloc(0x80);
  if (__ptr != (byte *)0x0) {
    uVar19 = 0x80;
    uVar14 = 0;
    do {
      iVar4 = fgetc(local_58);
      uVar17 = uVar14;
      if (iVar4 == -1) break;
      uVar17 = uVar14 + 1;
      pbVar11 = __ptr;
      if (uVar19 <= uVar17) {
        uVar19 = uVar19 + 0x80;
        pbVar11 = (byte *)realloc(__ptr,uVar19);
        if (pbVar11 == (byte *)0x0) goto LAB_001030ac;
      }
      __ptr = pbVar11;
      __ptr[uVar14] = (byte)iVar4;
      uVar14 = uVar17;
    } while (iVar4 != 10);
    __ptr[uVar17] = 0;
    if ((int)uVar17 < 1) goto LAB_001030ac;
    pbVar11 = __ptr + -1;
    __s1 = __ptr;
    __src = __ptr;
    while( true ) {
      __src = __src + 1;
      uVar14 = (ulong)*__s1;
      if (0x3d < uVar14) break;
      if ((0x100002600U >> (uVar14 & 0x3f) & 1) == 0) {
        if ((0x2000000800000001U >> (uVar14 & 0x3f) & 1) != 0) goto LAB_00102a1a;
        break;
      }
      __s1 = __s1 + 1;
      pbVar11 = pbVar11 + 1;
    }
    lVar7 = 0;
    pbVar20 = __s1;
    while ((char)uVar14 != '\0') {
      if ((int)uVar14 == 0x3d) goto LAB_00102a56;
      lVar7 = lVar7 + 1;
      bVar1 = *__src;
      __src = __src + 1;
      pbVar11 = pbVar11 + 1;
      pbVar20 = pbVar20 + 1;
      uVar14 = (ulong)bVar1;
    }
    goto LAB_00102a1a;
  }
  __ptr = (byte *)0x0;
LAB_001030ac:
  free(__ptr);
  iVar4 = 0;
  goto LAB_001030b7;
LAB_00102a56:
  if (lVar7 == 0) goto LAB_00102a70;
  if ((*pbVar11 != 0x20) && (*pbVar11 != 9)) goto LAB_00102a7a;
  lVar7 = lVar7 + -1;
  pbVar11 = pbVar11 + -1;
  goto LAB_00102a56;
LAB_00102a70:
  lVar7 = 0;
LAB_00102a7a:
  for (; (*__src == 9 || (*__src == 0x20)); __src = __src + 1) {
    pbVar20 = pbVar20 + 1;
  }
  uVar14 = 0xffffffffffffffff;
  pbVar11 = pbVar20;
  do {
    pbVar12 = pbVar11;
    lVar3 = uVar14 + 1;
    uVar14 = uVar14 + 1;
    pbVar11 = pbVar12 + 1;
  } while (__src[lVar3] != 0);
  bVar2 = true;
  for (; uVar14 != 0; uVar14 = uVar14 - 1) {
    if ((0x20 < (ulong)*pbVar12) || ((0x100002600U >> ((ulong)*pbVar12 & 0x3f) & 1) == 0)) {
      bVar2 = false;
      goto LAB_00102acf;
    }
    pbVar12 = pbVar12 + -1;
  }
  uVar14 = 0;
LAB_00102acf:
  iVar6 = 0;
  iVar4 = 0;
  switch(lVar7) {
  case 4:
    iVar5 = strncmp((char *)__s1,"Port",4);
    iVar4 = iVar6;
    if (iVar5 != 0) goto switchD_00102aea_caseD_5;
    iVar6 = __isoc99_sscanf(__src,"%hu%1s",local_40,local_6a);
    iVar4 = 0;
    if (iVar6 == 1) goto switchD_00102aea_caseD_5;
    pcVar9 = "Invalid configuration value for \'Port\': \'%.*s\'\n";
    goto LAB_00102d48;
  case 5:
  case 6:
  case 7:
  case 9:
  case 10:
  case 0xc:
  case 0xe:
  case 0x12:
    goto switchD_00102aea_caseD_5;
  case 8:
    iVar5 = strncmp((char *)__s1,"Password",8);
    iVar4 = iVar6;
    if (iVar5 != 0) goto switchD_00102aea_caseD_5;
    if (conf->password != (char *)0x0) {
      free(conf->password);
    }
    pcVar9 = (char *)malloc(uVar14 + 1);
    conf->password = pcVar9;
    if (pcVar9 == (char *)0x0) goto LAB_00103090;
    memcpy(pcVar9,__src,uVar14);
    pcVar9[uVar14] = '\0';
    iVar5 = strcmp(pcVar9,"notset");
    if (iVar5 != 0) goto switchD_00102aea_caseD_5;
    free(pcVar9);
    conf->password = (char *)0x0;
    log_printf(local_68,LOG_LEVEL_ERROR,"Error: Missing password\n");
    goto LAB_00102d54;
  case 0xb:
    iVar5 = strncmp((char *)__s1,"BindAddress",0xb);
    iVar4 = iVar6;
    if (iVar5 != 0) goto switchD_00102aea_caseD_5;
    if (conf->bind_addr != (char *)0x0) {
      free(conf->bind_addr);
    }
    if (bVar2) {
      conf->bind_addr = (char *)0x0;
      goto switchD_00102aea_caseD_5;
    }
    pcVar9 = (char *)malloc(uVar14 + 1);
    conf->bind_addr = pcVar9;
    break;
  case 0xd:
    iVar5 = strncmp((char *)__s1,"PublicAddress",0xd);
    iVar4 = iVar6;
    if (iVar5 != 0) goto switchD_00102aea_caseD_5;
    if (conf->public_addr != (char *)0x0) {
      free(conf->public_addr);
    }
    if (bVar2) {
      conf->public_addr = (char *)0x0;
      goto switchD_00102aea_caseD_5;
    }
    pcVar9 = (char *)malloc(uVar14 + 1);
    conf->public_addr = pcVar9;
    break;
  case 0xf:
    iVar5 = strncmp((char *)__s1,"CallsignsDenied",0xf);
    iVar4 = iVar6;
    if (iVar5 != 0) goto switchD_00102aea_caseD_5;
    if (conf->calls_denied != (char *)0x0) {
      free(conf->calls_denied);
    }
    if (bVar2) {
      conf->calls_denied = (char *)0x0;
      goto switchD_00102aea_caseD_5;
    }
    pcVar9 = (char *)malloc(uVar14 + 1);
    conf->calls_denied = pcVar9;
    break;
  case 0x10:
    iVar4 = strncmp((char *)__s1,"CallsignsAllowed",0x10);
    if (iVar4 == 0) {
      if (conf->calls_allowed != (char *)0x0) {
        free(conf->calls_allowed);
      }
      if (bVar2) {
        conf->calls_allowed = (char *)0x0;
        iVar4 = iVar6;
        goto switchD_00102aea_caseD_5;
      }
      pcVar9 = (char *)malloc(uVar14 + 1);
      conf->calls_allowed = pcVar9;
    }
    else {
      iVar5 = strncmp((char *)__s1,"RegistrationName",0x10);
      iVar4 = iVar6;
      if (iVar5 != 0) goto switchD_00102aea_caseD_5;
      if (conf->reg_name != (char *)0x0) {
        free(conf->reg_name);
      }
      if (bVar2) {
        conf->reg_name = (char *)0x0;
        goto switchD_00102aea_caseD_5;
      }
      pcVar9 = (char *)malloc(uVar14 + 1);
      conf->reg_name = pcVar9;
    }
    break;
  case 0x11:
    iVar5 = strncmp((char *)__s1,"ConnectionTimeout",0x11);
    iVar4 = iVar6;
    if (iVar5 != 0) goto switchD_00102aea_caseD_5;
    iVar6 = __isoc99_sscanf(__src,"%u%1s",local_38,local_6a);
    iVar4 = 0;
    if (iVar6 == 1) goto switchD_00102aea_caseD_5;
    pcVar9 = "Invalid configuration value for \'ConnectionTimeout\': \'%.*s\'\n";
LAB_00102d48:
    log_printf(local_68,LOG_LEVEL_ERROR,pcVar9,uVar14 & 0xffffffff,__src);
LAB_00102d54:
    iVar4 = -0x16;
    goto switchD_00102aea_caseD_5;
  case 0x13:
    iVar4 = strncmp((char *)__s1,"ExternalBindAddress",0x13);
    if (iVar4 == 0) {
      if (conf->bind_addr_ext != (char *)0x0) {
        free(conf->bind_addr_ext);
      }
      if (bVar2) {
        conf->bind_addr_ext = (char *)0x0;
        iVar4 = iVar6;
        goto switchD_00102aea_caseD_5;
      }
      pcVar9 = (char *)malloc(uVar14 + 1);
      conf->bind_addr_ext = pcVar9;
    }
    else {
      iVar5 = strncmp((char *)__s1,"RegistrationComment",0x13);
      iVar4 = iVar6;
      if (iVar5 != 0) goto switchD_00102aea_caseD_5;
      if (conf->reg_comment != (char *)0x0) {
        free(conf->reg_comment);
      }
      if (bVar2) {
        conf->reg_comment = (char *)0x0;
        goto switchD_00102aea_caseD_5;
      }
      pcVar9 = (char *)malloc(uVar14 + 1);
      conf->reg_comment = pcVar9;
    }
    break;
  default:
    if ((lVar7 != 0x1f) ||
       (iVar5 = strncmp((char *)__s1,"AdditionalExternalBindAddresses",0x1f), iVar4 = iVar6,
       iVar5 != 0)) goto switchD_00102aea_caseD_5;
    if (conf->bind_addr_ext_add != (char **)0x0) {
      free(conf->bind_addr_ext_add);
    }
    if (uVar14 == 0) {
      conf->bind_addr_ext_add = (char **)0x0;
      conf->bind_addr_ext_add_len = 0;
      goto switchD_00102aea_caseD_5;
    }
    if (uVar14 != 1) {
      uVar19 = 1;
      do {
        if (pbVar20[uVar19 + 1] == 0x2c) {
          conf->bind_addr_ext_add_len = conf->bind_addr_ext_add_len + 1;
        }
        uVar19 = uVar19 + 1;
      } while (uVar14 != uVar19);
    }
    uVar18 = *(int *)&conf->bind_addr_ext_add_len + 1;
    uVar19 = (ulong)uVar18;
    conf->bind_addr_ext_add_len = (uint16_t)uVar18;
    ppcVar8 = (char **)calloc((ulong)(uVar18 & 0xffff),8);
    conf->bind_addr_ext_add = ppcVar8;
    if (ppcVar8 != (char **)0x0) {
      if ((uint16_t)uVar18 != 0) {
        uVar17 = 0;
        uVar13 = 0;
LAB_00102be5:
        uVar16 = uVar17;
        uVar15 = uVar17;
        if (uVar17 < uVar14) {
          do {
            uVar16 = uVar15;
            if (__src[uVar15] == 0x2c) break;
            uVar15 = uVar15 + 1;
            uVar16 = uVar14;
          } while (uVar14 != uVar15);
        }
        __n = uVar16 - uVar17;
        local_60 = uVar13;
        local_50 = uVar19;
        local_48 = uVar17;
        pcVar9 = (char *)malloc(__n + 1);
        conf->bind_addr_ext_add[local_60] = pcVar9;
        ppcVar8 = conf->bind_addr_ext_add;
        if (ppcVar8[local_60] != (char *)0x0) goto code_r0x00102c41;
        if ((short)local_50 != 0) {
          uVar19 = 0;
          uVar14 = local_50;
          do {
            if (conf->bind_addr_ext_add[uVar19] != (char *)0x0) {
              free(conf->bind_addr_ext_add[uVar19]);
              uVar14 = (ulong)conf->bind_addr_ext_add_len;
            }
            uVar19 = uVar19 + 1;
          } while (uVar19 < (uVar14 & 0xffff));
          ppcVar8 = conf->bind_addr_ext_add;
        }
        free(ppcVar8);
        conf->bind_addr_ext_add = (char **)0x0;
        conf->bind_addr_ext_add_len = 0;
        goto LAB_00103090;
      }
      goto switchD_00102aea_caseD_5;
    }
    goto LAB_00103090;
  }
  if (pcVar9 == (char *)0x0) {
LAB_00103090:
    iVar4 = -0xc;
  }
  else {
    memcpy(pcVar9,__src,uVar14);
    pcVar9[uVar14] = '\0';
LAB_00102a1a:
    iVar4 = 0;
  }
switchD_00102aea_caseD_5:
  free(__ptr);
  if (iVar4 < 0) {
LAB_001030b7:
    fclose(local_58);
    return iVar4;
  }
  goto LAB_0010295c;
code_r0x00102c41:
  memcpy(ppcVar8[local_60],__src + local_48,__n);
  conf->bind_addr_ext_add[local_60][__n] = '\0';
  uVar17 = uVar16 + 1;
  uVar13 = local_60 + 1;
  uVar19 = (ulong)conf->bind_addr_ext_add_len;
  if (uVar19 <= uVar13) goto switchD_00102aea_caseD_5;
  goto LAB_00102be5;
}

Assistant:

int conf_parse_file(const char *file, struct proxy_conf *conf,
		    struct log_handle *log)
{
	FILE *stream;
	int ret;

	log_printf(log, LOG_LEVEL_DEBUG, "Loading proxy config from '%s'\n", file);

	stream = fopen(file, "r");
	if (stream == NULL)
		return -errno;

	ret = conf_parse_stream(stream, conf, log);

	fclose(stream);

	return ret;
}